

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  cmValue cVar4;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var5;
  char *pcVar6;
  string *psVar7;
  undefined8 s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  string_view arg;
  string_view arg_00;
  string mcUpper;
  string mapProp;
  string locPropBase;
  string locProp;
  string config_upper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableConfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  bool local_155;
  string local_150;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  string *local_120;
  string local_118;
  string local_f8;
  string local_c8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_88 = &local_78;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_120 = suffix;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_150,desired_config);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  iVar1 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if (iVar1 == 4) {
    pcVar6 = "IMPORTED_OBJECTS";
  }
  else if (iVar1 == 7) {
    pcVar6 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar6 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar6);
  local_150._M_string_length = (size_type)&local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)0x1;
  local_150.field_2._M_local_buf[0] = 0x5f;
  local_f8._M_dataplus._M_p = (pointer)0x1;
  local_f8.field_2._M_allocated_capacity = local_80;
  local_f8.field_2._8_8_ = local_88;
  views._M_len = 2;
  views._M_array = (iterator)&local_f8;
  local_f8._M_string_length = local_150._M_string_length;
  cmCatViews_abi_cxx11_(&local_118,views);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = (string *)0x0;
  local_38 = 0;
  local_150._M_dataplus._M_p = &DAT_00000014;
  local_150._M_string_length = 0x6e91cc;
  local_150.field_2._M_allocated_capacity = local_80;
  local_150.field_2._8_8_ = local_88;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_150;
  cmCatViews_abi_cxx11_(&local_f8,views_00);
  cVar4 = GetProperty(this,&local_f8);
  if (cVar4.Value != (string *)0x0) {
    arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar4.Value)->_M_string_length;
    cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  _Var5._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var5._M_head_impl)->IsDLLPlatform == true) {
    bVar3 = true;
    if (((_Var5._M_head_impl)->TargetType == 2) || (bVar2 = IsExecutableWithExports(this), bVar2))
    goto LAB_00282231;
    _Var5._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((_Var5._M_head_impl)->IsAIX == true) {
    bVar3 = IsExecutableWithExports(this);
  }
  else {
    bVar3 = false;
  }
LAB_00282231:
  if (loc->Value == (string *)0x0) {
    local_155 = true;
    s = local_48._M_allocated_capacity;
    do {
      psVar7 = imp->Value;
      if ((psVar7 != (string *)0x0) || (s == local_48._8_8_)) {
        if (local_48._M_allocated_capacity == local_48._8_8_) {
          if (psVar7 != (string *)0x0) goto LAB_00282512;
          local_150.field_2._8_8_ = (local_120->_M_dataplus)._M_p;
          local_150.field_2._M_allocated_capacity = local_120->_M_string_length;
          local_150._M_dataplus._M_p = (pointer)local_c8._M_string_length;
          local_150._M_string_length = (size_type)local_c8._M_dataplus._M_p;
          views_07._M_len = 2;
          views_07._M_array = (iterator)&local_150;
          cmCatViews_abi_cxx11_(&local_f8,views_07);
          cVar4 = GetProperty(this,&local_f8);
          loc->Value = (string *)cVar4;
          if (bVar3 != false) {
            local_150.field_2._8_8_ = (local_120->_M_dataplus)._M_p;
            local_150.field_2._M_allocated_capacity = local_120->_M_string_length;
            local_150._M_dataplus._M_p = (pointer)0xf;
            local_150._M_string_length = 0x6e97d5;
            views_08._M_len = 2;
            views_08._M_array = (iterator)&local_150;
            cmCatViews_abi_cxx11_(&local_118,views_08);
            cVar4 = GetProperty(this,&local_118);
            imp->Value = (string *)cVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          bVar2 = loc->Value != (string *)0x0;
        }
        else {
          if (psVar7 == (string *)0x0) goto LAB_0028282f;
LAB_00282512:
          bVar2 = false;
        }
        if ((!bVar2) && (imp->Value == (string *)0x0)) {
          local_120->_M_string_length = 0;
          *(local_120->_M_dataplus)._M_p = '\0';
          cVar4 = GetProperty(this,&local_c8);
          loc->Value = (string *)cVar4;
          if (bVar3 != false) {
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,"IMPORTED_IMPLIB","");
            cVar4 = GetProperty(this,&local_150);
            imp->Value = (string *)cVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            cVar4 = (cmValue)loc->Value;
          }
          psVar7 = imp->Value;
          if (psVar7 == (string *)0x0 && cVar4.Value == (string *)0x0) {
            local_68._0_8_ = (string *)0x0;
            local_68._8_8_ = (string *)0x0;
            local_68._16_8_ = 0;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,"IMPORTED_CONFIGURATIONS","");
            cVar4 = GetProperty(this,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if (cVar4.Value != (string *)0x0) {
              arg_00._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
              arg_00._M_len = (cVar4.Value)->_M_string_length;
              cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,false);
            }
            if (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
               (local_68._0_8_ != local_68._8_8_)) {
              psVar7 = (string *)local_68._0_8_;
              do {
                local_150._M_dataplus._M_p = (pointer)0x1;
                local_150._M_string_length = (size_type)&local_150.field_2;
                local_150.field_2._M_local_buf[0] = 0x5f;
                cmsys::SystemTools::UpperCase(&local_a8,psVar7);
                local_f8._M_dataplus._M_p = local_150._M_dataplus._M_p;
                local_f8._M_string_length = local_150._M_string_length;
                local_f8.field_2._M_allocated_capacity = local_a8._M_string_length;
                local_f8.field_2._8_8_ = local_a8._M_dataplus._M_p;
                views_04._M_len = 2;
                views_04._M_array = (iterator)&local_f8;
                cmCatViews_abi_cxx11_(&local_118,views_04);
                std::__cxx11::string::operator=((string *)local_120,(string *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                local_150.field_2._8_8_ = (local_120->_M_dataplus)._M_p;
                local_150.field_2._M_allocated_capacity = local_120->_M_string_length;
                local_150._M_dataplus._M_p = (pointer)local_c8._M_string_length;
                local_150._M_string_length = (size_type)local_c8._M_dataplus._M_p;
                views_05._M_len = 2;
                views_05._M_array = (iterator)&local_150;
                cmCatViews_abi_cxx11_(&local_f8,views_05);
                cVar4 = GetProperty(this,&local_f8);
                loc->Value = (string *)cVar4;
                if (bVar3 != false) {
                  local_150.field_2._8_8_ = (local_120->_M_dataplus)._M_p;
                  local_150.field_2._M_allocated_capacity = local_120->_M_string_length;
                  local_150._M_dataplus._M_p = (pointer)0xf;
                  local_150._M_string_length = 0x6e97d5;
                  views_06._M_len = 2;
                  views_06._M_array = (iterator)&local_150;
                  cmCatViews_abi_cxx11_(&local_118,views_06);
                  cVar4 = GetProperty(this,&local_118);
                  imp->Value = (string *)cVar4;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
              } while (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
                      (psVar7 = psVar7 + 1, psVar7 != (string *)local_68._8_8_));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
            cVar4 = (cmValue)loc->Value;
            psVar7 = imp->Value;
          }
          if (psVar7 != (string *)0x0 || cVar4.Value != (string *)0x0) break;
LAB_0028282f:
          local_155 = ((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType
                      == 7;
        }
        break;
      }
      if (((string *)s)->_M_string_length == 0) {
        cVar4 = GetProperty(this,&local_c8);
        loc->Value = (string *)cVar4;
        if (bVar3 != false) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"IMPORTED_IMPLIB","")
          ;
          cVar4 = GetProperty(this,&local_150);
          imp->Value = (string *)cVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          cVar4 = (cmValue)loc->Value;
        }
        if (cVar4.Value != (string *)0x0 || imp->Value != (string *)0x0) {
          local_120->_M_string_length = 0;
          *(local_120->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        cmsys::SystemTools::UpperCase(&local_118,(string *)s);
        local_f8._M_dataplus._M_p = (pointer)0x1;
        local_150.field_2._8_8_ = &local_f8.field_2;
        local_f8.field_2._M_local_buf[0] = 0x5f;
        local_150._M_dataplus._M_p = (pointer)local_c8._M_string_length;
        local_150._M_string_length = (size_type)local_c8._M_dataplus._M_p;
        local_150.field_2._M_allocated_capacity = 1;
        local_130 = local_118._M_string_length;
        local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_150;
        local_f8._M_string_length = local_150.field_2._8_8_;
        cmCatViews_abi_cxx11_(&local_a8,views_01);
        cVar4 = GetProperty(this,&local_a8);
        loc->Value = (string *)cVar4;
        if (bVar3 != false) {
          local_150._M_dataplus._M_p = (pointer)0x10;
          local_150._M_string_length = 0x6e987b;
          local_150.field_2._M_allocated_capacity = local_118._M_string_length;
          local_150.field_2._8_8_ = local_118._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_150;
          cmCatViews_abi_cxx11_(&local_f8,views_02);
          cVar4 = GetProperty(this,&local_f8);
          imp->Value = (string *)cVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          cVar4 = (cmValue)loc->Value;
        }
        if (cVar4.Value != (string *)0x0 || imp->Value != (string *)0x0) {
          local_150._M_dataplus._M_p = (pointer)0x1;
          local_150._M_string_length = (size_type)&local_150.field_2;
          local_150.field_2._M_local_buf[0] = 0x5f;
          local_f8._M_dataplus._M_p = (pointer)0x1;
          local_f8.field_2._M_allocated_capacity = local_118._M_string_length;
          local_f8.field_2._8_8_ = local_118._M_dataplus._M_p;
          views_03._M_len = 2;
          views_03._M_array = (iterator)&local_f8;
          local_f8._M_string_length = local_150._M_string_length;
          cmCatViews_abi_cxx11_((string *)local_68,views_03);
          std::__cxx11::string::operator=((string *)local_120,(string *)local_68);
          if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      s = s + 0x20;
    } while (loc->Value == (string *)0x0);
  }
  else {
    local_155 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                             + 1);
  }
  return local_155;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      cmExpandList(*mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = (this->IsDLLPlatform() &&
                   (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                    this->IsExecutableWithExports())) ||
    (this->IsAIX() && this->IsExecutableWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    std::vector<std::string> availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmExpandList(*iconfigs, availableConfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}